

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

StringRef * __thiscall Catch::StringRef::operator=(StringRef *this,StringRef *other)

{
  if (other != this) {
    if ((this->m_ownership == FullStringOwned) && (this->m_data != (char *)0x0)) {
      operator_delete(this->m_data,1);
    }
    this->m_data = other->m_data;
    this->m_size = other->m_size;
    this->m_ownership = other->m_ownership;
    if (other->m_ownership == FullStringOwned) {
      other->m_ownership = FullStringRef;
    }
  }
  return this;
}

Assistant:

auto StringRef::operator = ( StringRef&& other ) -> StringRef& {
        if( &other == this )
            return *this;
        deleteIfOwned();
        m_data = other.m_data;
        m_size = other.m_size;
        m_ownership = other.m_ownership;
        if( other.m_ownership == Ownership::FullStringOwned )
            other.m_ownership = Ownership::FullStringRef;
            return *this;
    }